

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosDynamicBinder.cpp
# Opt level: O2

void __thiscall
adios2::helper::DynamicBinder::DynamicBinder(DynamicBinder *this,string *libName,string *libPath)

{
  DynamicBinder *pDVar1;
  pointer pbVar2;
  pointer pbVar3;
  _Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false> _Var4;
  Impl IVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator local_2f3;
  allocator local_2f2;
  allocator local_2f1;
  DynamicBinder *local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  string *local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchedLibs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libSuffixes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libPrefixes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  string fileName;
  stringstream errString;
  ostream local_1a8 [376];
  
  local_2e0 = libName;
  _Var4._M_head_impl = (Impl *)operator_new(8);
  (this->m_Impl)._M_t.
  super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
  .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl =
       _Var4._M_head_impl;
  libPrefixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  libPrefixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  libPrefixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&libPrefixes,
             (char (*) [1])0x6eb291);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&libPrefixes,
             (char (*) [4])0x6ec216);
  libSuffixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  libSuffixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  libSuffixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f0 = this;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&libSuffixes,
             (char (*) [1])0x6eb291);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&libSuffixes,
             (char (*) [4])".so");
  pbVar3 = libPrefixes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  searchedLibs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  searchedLibs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  searchedLibs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
  fileName._M_string_length = 0;
  fileName.field_2._M_local_buf[0] = '\0';
  local_2e8 = libPrefixes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar2 = libSuffixes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        __rhs = libSuffixes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start, local_2e8 != pbVar3) {
    while (__rhs != pbVar2) {
      if (libPath->_M_string_length == 0) {
        std::operator+(&local_268,local_2e8,local_2e0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &errString,&local_268,__rhs);
        std::__cxx11::string::operator=((string *)&fileName,(string *)&errString);
        std::__cxx11::string::~string((string *)&errString);
        this_00 = &local_268;
      }
      else {
        std::operator+(&local_248,libPath,"/");
        std::operator+(&local_228,&local_248,local_2e8);
        std::operator+(&local_268,&local_228,local_2e0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &errString,&local_268,__rhs);
        std::__cxx11::string::operator=((string *)&fileName,(string *)&errString);
        std::__cxx11::string::~string((string *)&errString);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        adios2sys::SystemTools::ConvertToOutputPath
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errString,
                   &fileName);
        std::__cxx11::string::operator=((string *)&fileName,(string *)&errString);
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errString;
      }
      std::__cxx11::string::~string((string *)this_00);
      pDVar1 = local_2f0;
      IVar5.m_LibraryHandle = adios2sys::DynamicLoader::OpenLibrary(&fileName);
      ((pDVar1->m_Impl)._M_t.
       super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
       .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl)->
      m_LibraryHandle = IVar5.m_LibraryHandle;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&searchedLibs,&fileName);
      __rhs = __rhs + 1;
      if (((pDVar1->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
           .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl)->
          m_LibraryHandle != (LibraryHandle)0x0) goto LAB_0045f36d;
    }
    local_2e8 = local_2e8 + 1;
    if (((local_2f0->m_Impl)._M_t.
         super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
         .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl)->
        m_LibraryHandle != (LibraryHandle)0x0) goto LAB_0045f36d;
  }
  if (((local_2f0->m_Impl)._M_t.
       super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
       .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl)->
      m_LibraryHandle == (LibraryHandle)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&errString);
    poVar6 = std::operator<<(local_1a8,"Unable to locate the ");
    poVar6 = std::operator<<(poVar6,(string *)local_2e0);
    std::operator<<(poVar6," library; searched for ");
    std::
    copy<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>>
              (&local_268,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )searchedLibs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
                *)searchedLibs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::string((string *)&local_268,"Helper",&local_2f1);
    std::__cxx11::string::string((string *)&local_228,"adiosDynamicBinder",&local_2f2);
    std::__cxx11::string::string((string *)&local_248,"DynamicBinder",&local_2f3);
    std::__cxx11::stringbuf::str();
    Throw<std::runtime_error>(&local_268,&local_228,&local_248,&local_208,-1);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::stringstream::~stringstream((stringstream *)&errString);
  }
LAB_0045f36d:
  std::__cxx11::string::~string((string *)&fileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&searchedLibs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&libSuffixes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&libPrefixes);
  return;
}

Assistant:

DynamicBinder::DynamicBinder(std::string libName, std::string libPath) : m_Impl(new Impl)
{
    std::vector<std::string> libPrefixes;
    libPrefixes.emplace_back("");
    libPrefixes.emplace_back("lib");
#ifdef __CYGWIN__
    libPrefixes.emplace_back("cyg");
#endif

    std::vector<std::string> libSuffixes;
    libSuffixes.emplace_back("");
#ifdef __APPLE__
    libSuffixes.emplace_back(".dylib");
    libSuffixes.emplace_back(".so");
#endif
#ifdef __hpux
    libSuffixes.emplace_back(".sl");
#endif
#ifdef __unix__
    libSuffixes.emplace_back(".so");
#endif
#ifdef _WIN32
    libSuffixes.emplace_back(".dll");
#endif

    std::vector<std::string> searchedLibs;
    std::string fileName;

    // Test the various combinations of library names
    for (const std::string &prefix : libPrefixes)
    {
        for (const std::string &suffix : libSuffixes)
        {
            if (!libPath.empty())
            {
                fileName = libPath + "/" + prefix + libName + suffix;
                // Slashes in fileName is correct for unix-like systems
                // ConvertToOutputPath() will change slashes if we're running on
                // a Windows system
                fileName = adios2sys::SystemTools::ConvertToOutputPath(fileName);
            }
            else
            {
                fileName = prefix + libName + suffix;
            }
            m_Impl->m_LibraryHandle = adios2sys::DynamicLoader::OpenLibrary(fileName);
            searchedLibs.push_back(fileName);
            if (m_Impl->m_LibraryHandle)
            {
                break;
            }
        }
        if (m_Impl->m_LibraryHandle)
        {
            break;
        }
    }
    if (!m_Impl->m_LibraryHandle)
    {
        std::stringstream errString;
        errString << "Unable to locate the " << libName << " library; searched for ";
        std::copy(searchedLibs.begin(), searchedLibs.end(),
                  std::ostream_iterator<std::string>(errString, " "));

        helper::Throw<std::runtime_error>("Helper", "adiosDynamicBinder", "DynamicBinder",
                                          errString.str());
    }
}